

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O0

int bucket_remove(bucket b,comparable_callback compare_cb,void *key,void **value)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *__dest;
  bucket b_00;
  ulong new_capacity_00;
  undefined8 *in_RCX;
  long in_RDX;
  code *in_RSI;
  ulong *in_RDI;
  size_t new_capacity;
  size_t next;
  void *deleted_value;
  pair p;
  size_t iterator;
  ulong local_30;
  
  if (((in_RDI == (ulong *)0x0) || (in_RSI == (code *)0x0)) || (in_RDX == 0)) {
    log_write_impl_va("metacall",0x115,"bucket_remove",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,LOG_LEVEL_ERROR,"Invalid bucket remove parameters");
  }
  else if ((in_RDI[2] == 0) || (*in_RDI == 0)) {
    log_write_impl_va("metacall",0x11b,"bucket_remove",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,LOG_LEVEL_ERROR,"Invalid bucket remove pairs");
  }
  else {
    for (local_30 = 0; local_30 < *in_RDI; local_30 = local_30 + 1) {
      __dest = (undefined8 *)(in_RDI[2] + local_30 * 0x10);
      iVar2 = (*in_RSI)(in_RDX,*__dest);
      if (iVar2 == 0) {
        uVar1 = __dest[1];
        b_00 = (bucket)(local_30 + 1);
        new_capacity_00 = in_RDI[1] >> 1;
        memmove(__dest,(void *)(in_RDI[2] + (long)b_00 * 0x10),(*in_RDI - (long)b_00) * 0x10);
        *in_RDI = *in_RDI - 1;
        if (((*in_RDI <= new_capacity_00) && (4 < new_capacity_00)) &&
           (iVar2 = bucket_realloc_pairs(b_00,new_capacity_00), iVar2 != 0)) {
          log_write_impl_va("metacall",0x133,"bucket_remove",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                            ,LOG_LEVEL_ERROR,"Invalid bucket remove pairs reallocation");
          return 1;
        }
        if (in_RCX != (undefined8 *)0x0) {
          *in_RCX = uVar1;
        }
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int bucket_remove(bucket b, comparable_callback compare_cb, void *key, void **value)
{
	size_t iterator;

	if (b == NULL || compare_cb == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove parameters");
		return 1;
	}

	if (b->pairs == NULL || b->count == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove pairs");
		return 1;
	}

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			void *deleted_value = p->value;

			size_t next = iterator + 1;

			size_t new_capacity = b->capacity >> 1;

			memmove(p, &b->pairs[next], sizeof(struct pair_type) * (b->count - next));

			--b->count;

			if (b->count <= new_capacity && new_capacity > BUCKET_PAIRS_DEFAULT)
			{
				if (bucket_realloc_pairs(b, new_capacity) != 0)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove pairs reallocation");
					return 1;
				}
			}

			if (value != NULL)
			{
				*value = deleted_value;
			}

			return 0;
		}
	}

	return 1;
}